

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

bool __thiscall
cmStandardLevelResolver::GetNewRequiredStandard
          (cmStandardLevelResolver *this,string *targetName,string *feature,
          cmValue currentLangStandardValue,string *newRequiredStandard,string *error)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
  local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
  local_78;
  iterator mapping;
  undefined1 local_60 [8];
  string lang;
  string *error_local;
  string *newRequiredStandard_local;
  string *feature_local;
  string *targetName_local;
  cmStandardLevelResolver *this_local;
  cmValue currentLangStandardValue_local;
  
  lang.field_2._8_8_ = error;
  std::__cxx11::string::string((string *)local_60);
  bVar1 = CheckCompileFeaturesAvailable
                    (this,targetName,feature,(string *)local_60,(string *)lang.field_2._8_8_);
  if (bVar1) {
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                 *)(anonymous_namespace)::StandardComputerMapping_abi_cxx11_,(key_type *)local_60);
    local_80._M_cur =
         (__node_type *)
         std::
         cend<std::unordered_map<std::__cxx11::string,(anonymous_namespace)::StandardLevelComputer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::StandardLevelComputer>>>>
                   ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                     *)(anonymous_namespace)::StandardComputerMapping_abi_cxx11_);
    bVar1 = std::__detail::operator!=(&local_78,&local_80);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_false,_true>
                             *)&local_78);
      currentLangStandardValue_local.Value._7_1_ =
           anon_unknown.dwarf_76bb59::StandardLevelComputer::GetNewRequiredStandard
                     (&ppVar2->second,this->Makefile,targetName,feature,currentLangStandardValue,
                      newRequiredStandard,(string *)lang.field_2._8_8_);
    }
    else {
      currentLangStandardValue_local.Value._7_1_ = false;
    }
  }
  else {
    currentLangStandardValue_local.Value._7_1_ = false;
  }
  mapping.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
  ._M_cur._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_60);
  return currentLangStandardValue_local.Value._7_1_;
}

Assistant:

bool cmStandardLevelResolver::GetNewRequiredStandard(
  const std::string& targetName, const std::string& feature,
  cmValue currentLangStandardValue, std::string& newRequiredStandard,
  std::string* error) const
{
  std::string lang;
  if (!this->CheckCompileFeaturesAvailable(targetName, feature, lang, error)) {
    return false;
  }

  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.GetNewRequiredStandard(
      this->Makefile, targetName, feature, currentLangStandardValue,
      newRequiredStandard, error);
  }
  return false;
}